

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O2

bool __thiscall
FTextureShader::ParseShader(FTextureShader *this,FScanner *sc,TArray<FTextureID,_FTextureID> *names)

{
  bool bVar1;
  FShaderLayer *pFVar2;
  bool bVar3;
  FShaderLayer *lay;
  FShaderLayer *local_40;
  TArray<FShaderLayer_*,_FShaderLayer_*> *local_38;
  
  bVar1 = FScanner::GetString(sc);
  bVar3 = true;
  if (bVar1) {
    FName::operator=(&this->name,sc->String);
    FScanner::MustGetStringName(sc,"{");
    local_38 = &(this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>;
    bVar3 = true;
    while (bVar1 = FScanner::CheckString(sc,"}"), !bVar1) {
      if (sc->End == true) {
        FScanner::ScriptError(sc,"Unexpected end of file encountered");
        return false;
      }
      bVar1 = FScanner::Compare(sc,"layer");
      if (bVar1) {
        pFVar2 = (FShaderLayer *)operator_new(0x188);
        FShaderLayer::FShaderLayer(pFVar2);
        local_40 = pFVar2;
        bVar1 = FShaderLayer::ParseLayer(pFVar2,sc);
        pFVar2 = local_40;
        if (bVar1) {
          if ((this->layers).super_TArray<FShaderLayer_*,_FShaderLayer_*>.Count < 8) {
            TArray<FShaderLayer_*,_FShaderLayer_*>::Push(local_38,&local_40);
          }
          else {
            if (local_40 != (FShaderLayer *)0x0) {
              FShaderLayer::~FShaderLayer(local_40);
            }
            operator_delete(pFVar2,0x188);
            FScanner::ScriptMessage(sc,"Only 8 layers per texture allowed.");
          }
        }
        else {
          if (local_40 != (FShaderLayer *)0x0) {
            FShaderLayer::~FShaderLayer(local_40);
          }
          operator_delete(pFVar2,0x188);
          bVar3 = false;
        }
      }
      else {
        FScanner::ScriptError(sc,"Unknown keyword \'%s\' in shader",sc->String);
      }
    }
  }
  return bVar3;
}

Assistant:

bool FTextureShader::ParseShader(FScanner &sc, TArray<FTextureID> &names)
{
	bool retval = true;

	if (sc.GetString())
	{
		name = sc.String;

		sc.MustGetStringName("{");
		while (!sc.CheckString("}"))
		{
			if (sc.End)
			{
				sc.ScriptError("Unexpected end of file encountered");
				return false;
			}
			else if (sc.Compare("layer"))
			{
				FShaderLayer *lay = new FShaderLayer;
				if (lay->ParseLayer(sc))
				{
					if (layers.Size() < 8)
					{
						layers.Push(lay);
					}
					else
					{
						delete lay;
						sc.ScriptMessage("Only 8 layers per texture allowed.");
					}
				}
				else
				{
					delete lay;
					retval = false;
				}
			}
			else
			{
				sc.ScriptError("Unknown keyword '%s' in shader", sc.String);
			}
		}
	}
	return retval;
}